

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::CLUFactor<double>::updateRow
          (CLUFactor<double> *this,int r,int lv,int prow,int pcol,double pval,double eps)

{
  int *piVar1;
  int *piVar2;
  pointer pdVar3;
  int *piVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  Pring *pPVar10;
  Pring *pPVar11;
  Pring *pPVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  double dVar25;
  double dVar26;
  int local_7c;
  
  piVar15 = (this->u).row.start;
  piVar14 = (this->u).row.len;
  iVar24 = piVar15[r];
  iVar16 = piVar14[r];
  piVar14[r] = iVar16 + -1;
  local_7c = iVar16 + -1 + iVar24;
  piVar2 = (this->u).row.idx;
  lVar23 = (long)local_7c;
  lVar22 = lVar23 * 4 + 4;
  do {
    lVar21 = lVar22 + -4;
    lVar13 = lVar22 + -4;
    lVar22 = lVar21;
  } while (*(int *)((long)piVar2 + lVar13) != pcol);
  pdVar3 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar26 = *(double *)((long)pdVar3 + lVar21 * 2) / pval;
  (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lv] = dVar26;
  (this->l).idx[lv] = r;
  *(int *)((long)piVar2 + lVar21) = piVar2[lVar23];
  *(double *)((long)pdVar3 + lVar21 * 2) = pdVar3[lVar23];
  iVar16 = piVar14[prow];
  piVar4 = (this->temp).s_mark;
  pdVar5 = this->work;
  piVar6 = (this->temp).s_cact;
  piVar7 = (this->u).col.len;
  piVar8 = (this->u).col.idx;
  piVar9 = (this->u).col.start;
  while (iVar24 < lVar23) {
    iVar17 = piVar2[lVar23 + -1];
    lVar23 = lVar23 + -1;
    if (piVar4[iVar17] != 0) {
      piVar4[iVar17] = 0;
      iVar16 = iVar16 + -1;
      dVar25 = pdVar3[lVar23] - pdVar5[iVar17] * dVar26;
      pdVar3[lVar23] = dVar25;
      if (ABS(dVar25) <= eps) {
        piVar14[r] = piVar14[r] + -1;
        pdVar3[lVar23] = pdVar3[(long)local_7c + -1];
        piVar2[lVar23] = piVar2[(long)local_7c + -1];
        piVar18 = piVar6 + iVar17;
        *piVar18 = *piVar18 + -1;
        local_7c = local_7c + -1;
        iVar20 = piVar7[iVar17] + -1;
        piVar7[iVar17] = iVar20;
        lVar22 = (long)(iVar20 + piVar9[iVar17]);
        piVar18 = piVar8 + lVar22 + 1;
        do {
          piVar19 = piVar18 + -1;
          piVar1 = piVar18 + -1;
          piVar18 = piVar19;
        } while (*piVar1 != r);
        *piVar19 = piVar8[lVar22];
      }
    }
  }
  iVar24 = piVar14[r];
  iVar16 = iVar16 + iVar24;
  if ((this->u).row.max[r] < iVar16) {
    remaxRow(this,r,iVar16);
    piVar15 = (this->u).row.start;
    piVar14 = (this->u).row.len;
  }
  iVar24 = iVar24 + piVar15[r];
  lVar22 = (long)piVar15[prow];
  lVar23 = piVar14[prow] + lVar22;
  for (; lVar22 < lVar23; lVar22 = lVar22 + 1) {
    piVar15 = (this->u).row.idx;
    piVar14 = (this->temp).s_mark;
    iVar16 = piVar15[lVar22];
    if (piVar14[iVar16] == 0) {
      piVar14[iVar16] = 1;
    }
    else {
      dVar25 = -this->work[iVar16] * dVar26;
      if (eps < ABS(dVar25)) {
        (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar24] = dVar25;
        piVar15[iVar24] = iVar16;
        piVar15 = (this->u).row.len + r;
        *piVar15 = *piVar15 + 1;
        piVar15 = (this->u).col.len;
        iVar17 = piVar15[iVar16];
        if ((this->u).col.max[iVar16] <= iVar17) {
          remaxCol(this,iVar16,iVar17 + 1);
          piVar15 = (this->u).col.len;
          iVar17 = piVar15[iVar16];
        }
        iVar24 = iVar24 + 1;
        piVar14 = (this->u).col.idx;
        iVar20 = (this->u).col.start[iVar16];
        piVar15[iVar16] = iVar17 + 1;
        piVar14[(long)iVar17 + (long)iVar20] = r;
        piVar15 = (this->temp).s_cact + iVar16;
        *piVar15 = *piVar15 + 1;
      }
    }
  }
  pPVar10 = (this->temp).pivot_row;
  pPVar11 = pPVar10[r].next;
  pPVar12 = pPVar10[r].prev;
  pPVar11->prev = pPVar12;
  pPVar12->next = pPVar11;
  pPVar11 = (this->temp).pivot_rowNZ;
  iVar24 = (this->u).row.len[r];
  pPVar12 = pPVar11[iVar24].next;
  pPVar10[r].next = pPVar12;
  pPVar12->prev = pPVar10 + r;
  pPVar10[r].prev = pPVar11 + iVar24;
  pPVar11[iVar24].next = pPVar10 + r;
  (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[r] = -1.0;
  return lv + 1;
}

Assistant:

int CLUFactor<R>::updateRow(int r,
                            int lv,
                            int prow,
                            int pcol,
                            R pval,
                            R eps)
{
   int fill;
   R x, lx;
   int c, i, j, k, ll, m, n;

   n = u.row.start[r];
   m = --(u.row.len[r]) + n;

   /*  compute L VectorBase<R> entry and
    *  and remove pivot column form row file
    */

   for(j = m; u.row.idx[j] != pcol; --j)
      ;

   lx = u.row.val[j] / pval;

   l.val[lv] = lx;

   l.idx[lv] = r;

   ++lv;

   u.row.idx[j] = u.row.idx[m];

   u.row.val[j] = u.row.val[m];


   /*  update loop (I) and
    *  computing expected fill
    */
   fill = u.row.len[prow];

   for(j = m - 1; j >= n; --j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         /*  count fill elements.
          */
         temp.s_mark[c] = 0;
         --fill;

         /*  update row values
          */
         x = u.row.val[j] -= work[c] * lx;

         if(isZero(x, eps))
         {
            /* Eliminate zero from row r
             */
            --u.row.len[r];
            --m;
            u.row.val[j] = u.row.val[m];
            u.row.idx[j] = u.row.idx[m];

            /* Eliminate zero from column c
             */
            --(temp.s_cact[c]);
            k = --(u.col.len[c]) + u.col.start[c];

            for(i = k; u.col.idx[i] != r; --i)
               ;

            u.col.idx[i] = u.col.idx[k];
         }
      }
   }


   /*  create space for fill in row file
    */
   ll = u.row.len[r];

   if(ll + fill > u.row.max[r])
      remaxRow(r, ll + fill);

   ll += u.row.start[r];

   /*  fill creating update loop (II)
    */
   for(j = u.row.start[prow], m = j + u.row.len[prow]; j < m; ++j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         x = - work[c] * lx;

         if(isNotZero(x, eps))
         {
            /* produce fill element in row r
             */
            u.row.val[ll] = x;
            u.row.idx[ll] = c;
            ll++;
            u.row.len[r]++;

            /* produce fill element in column c
             */

            if(u.col.len[c] >= u.col.max[c])
               remaxCol(c, u.col.len[c] + 1);

            u.col.idx[u.col.start[c] + (u.col.len[c])++] = r;

            temp.s_cact[c]++;
         }
      }
      else
         temp.s_mark[c] = 1;
   }

   /*  move row to appropriate list.
    */
   removeDR(temp.pivot_row[r]);

   init2DR(temp.pivot_row[r], temp.pivot_rowNZ[u.row.len[r]]);

   assert(row.perm[r] < 0);

   temp.s_max[r] = -1;

   return lv;
}